

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getPressure(Thermo *this,Snapshot *snap)

{
  RealType RVar1;
  Mat3x3d tensor;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  if (snap->hasPressure == false) {
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_68);
    getPressureTensor((Mat3x3d *)&local_b0,this,snap);
    RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_b0);
    Snapshot::setPressure
              (snap,((local_68.data_[0][0] + local_68.data_[1][1] + local_68.data_[2][2]) *
                    163882576.0) / 3.0);
  }
  RVar1 = Snapshot::getPressure(snap);
  return RVar1;
}

Assistant:

RealType Thermo::getPressure(Snapshot* snap) {
    if (!snap->hasPressure) {
      // Relies on the calculation of the full molecular pressure tensor
      Mat3x3d tensor;
      RealType pressure;

      tensor = getPressureTensor(snap);

      pressure = Constants::pressureConvert *
                 (tensor(0, 0) + tensor(1, 1) + tensor(2, 2)) / 3.0;

      snap->setPressure(pressure);
    }

    return snap->getPressure();
  }